

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

int ImParseFormatPrecision(char *fmt,int default_precision)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  uint local_14;
  
  while( true ) {
    cVar1 = *fmt;
    if (cVar1 == '\0') {
      return default_precision;
    }
    if ((cVar1 == '%') && (fmt[1] != '%')) break;
    fmt = fmt + (ulong)(cVar1 == '%') + 1;
  }
  pcVar3 = fmt + 1;
  do {
    cVar1 = *pcVar3;
    pcVar3 = pcVar3 + 1;
  } while ((byte)(cVar1 - 0x30U) < 10);
  local_14 = 0x7fffffff;
  uVar2 = 0x7fffffff;
  if (cVar1 == '.') {
    pcVar3 = ImAtoi<int>(pcVar3,(int *)&local_14);
    uVar2 = local_14;
    if (99 < local_14) {
      uVar2 = default_precision;
    }
    cVar1 = *pcVar3;
  }
  if ((cVar1 != 'E') && (cVar1 != 'e')) {
    if (cVar1 == 'g') {
      if (uVar2 != 0x7fffffff) {
        return uVar2;
      }
    }
    else if ((cVar1 != 'G') || (uVar2 != 0x7fffffff)) {
      if (uVar2 != 0x7fffffff) {
        return uVar2;
      }
      return default_precision;
    }
  }
  return -1;
}

Assistant:

int ImParseFormatPrecision(const char* fmt, int default_precision)
{
    fmt = ImParseFormatFindStart(fmt);
    if (fmt[0] != '%')
        return default_precision;
    fmt++;
    while (*fmt >= '0' && *fmt <= '9')
        fmt++;
    int precision = INT_MAX;
    if (*fmt == '.')
    {
        fmt = ImAtoi<int>(fmt + 1, &precision);
        if (precision < 0 || precision > 99)
            precision = default_precision;
    }
    if (*fmt == 'e' || *fmt == 'E') // Maximum precision with scientific notation
        precision = -1;
    if ((*fmt == 'g' || *fmt == 'G') && precision == INT_MAX)
        precision = -1;
    return (precision == INT_MAX) ? default_precision : precision;
}